

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void metal_slime(dw_rom *rom)

{
  vpatch(rom,0x13b4,0x50,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50,2,0x51,2,0x52,
         2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,
         2,0x50,2,0x51,2,0x52,2,0x53,2,0x54,2,0x55,2,0x56,2,0x57,2,0x50);
  vpatch(rom,0x14b4,0x4e,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48,2,0x49,2,0x4a,
         2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,
         2,0x48,2,0x49,2,0x4a,2,0x4b,2,0x4c,2,0x4d,2,0x4e,2,0x4f,2,0x48);
  vpatch(rom,0x15b4,0x44,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0x30,2,0x31,2,0x32,
         2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,
         2,0x30,2,0x31,2,0x32,2,0x33,2,0x34,2,0x35,2,0x36,2,0x37,2,0xb4);
  vpatch(rom,0x15fe,2,0x35,2);
  vpatch(rom,0x16b4,0x44,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0x40,2,0x41,2,0x42,
         2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,
         2,0x40,2,0x41,2,0x42,2,0x43,2,0x44,2,0x45,2,0x46,2,0x47,2,0xb8);
  vpatch(rom,0x16fe,2,0x45,2);
  vpatch(rom,0x1a8d,7,0x11,0x35,0x27,0x1a,0x30,0,0xf);
  vpatch(rom,0x12300,0x80,0,0,0,0,0,0,0,0x18,0,0,0,0,1,3,0xf,7,0,0,0,0,0,0,0,0,0x80,0x80,0x80,0x80,
         0xc0,0xe0,0xf8,0xfc,0x30,0x22,5,5,2,8,7,0,0xf,0x5d,0x7a,0x7a,0x7d,0x7f,0x3f,0xf,0,0x20,0x50
         ,0x50,0x20,8,0xf0,0,0xfe,0xdf,0xaf,0xaf,0xdf,0xff,0xfe,0xf8,0);
  vpatch(rom,0x12400,0x180,0,0,0,0,0,0,0,0,1,1,1,1,3,7,0x1f,0x3f,0,0,0,0,0,0,0,0x18,0,0,0,0,0x80,
         0xc0,0xf0,0xe0,0,0x20,0x50,0x50,0x20,8,0x30,0,0x7f,0xdf,0xaf,0xaf,0xdf,0xff,0x3f,0x1f,0xc,4
         ,0,0,0,0,0,0,0xf0,0xfa,0xfe,0xfe,0xfe,0xfe,0xfc,0xf0,0);
  vpatch(rom,0x12b25,2,0,0);
  vpatch(rom,0x12b2e,1,0);
  vpatch(rom,0x12b37,1,0);
  vpatch(rom,0x12b3f,1,0);
  vpatch(rom,0x12b50,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12b65,3,0,0,0);
  vpatch(rom,0x12b6f,1,0);
  vpatch(rom,0x12b75,3,8,0x10,0);
  vpatch(rom,0x12b7f,1,0);
  vpatch(rom,0x12ba7,1,0);
  vpatch(rom,0x12baf,1,0);
  vpatch(rom,0x12bb7,1,0);
  vpatch(rom,0x12bbf,1,0);
  vpatch(rom,0x12be6,1,0);
  vpatch(rom,0x12bee,1,0);
  vpatch(rom,0x12bf6,2,0,0);
  vpatch(rom,0x12bfe,2,0,0);
  return;
}

Assistant:

static void metal_slime(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   80,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02,  0x50,  0x02,  0x51,  0x02,  0x52,  0x02,  0x53,  0x02,  0x54,  0x02,  0x55,  0x02,  0x56,  0x02,  0x57,  0x02);
    vpatch(rom, 0x014b4,   78,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x02,  0x4b,  0x02,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x02,  0x4f,  0x02,  0x48,  0x02,  0xa9,  0x03,  0x4a,  0x02,  0xab,  0x03,  0x4c,  0x02,  0xad,  0x03,  0x4e,  0x02);
    vpatch(rom, 0x015b4,   68,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0x30,  0x02,  0x31,  0x02,  0x32,  0x02,  0x33,  0x02,  0x34,  0x02,  0x35,  0x02,  0x36,  0x02,  0x37,  0x02,  0xb4,  0x03,  0x31,  0x02);
    vpatch(rom, 0x015fe,    2,  0x35,  0x02);
    vpatch(rom, 0x016b4,   68,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0x40,  0x02,  0x41,  0x02,  0x42,  0x02,  0x43,  0x02,  0x44,  0x02,  0x45,  0x02,  0x46,  0x02,  0x47,  0x02,  0xb8,  0x03,  0x41,  0x02);
    vpatch(rom, 0x016fe,    2,  0x45,  0x02);
    vpatch(rom, 0x01a8d,    7,  0x11,  0x35,  0x27,  0x1a,  0x30,  0x00,  0x0f);
    vpatch(rom, 0x12300,  128,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x18,  0x00,  0x00,  0x00,  0x00,  0x01,  0x03,  0x0f,  0x07,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x80,  0x80,  0x80,  0x80,  0xc0,  0xe0,  0xf8,  0xfc,  0x30,  0x22,  0x05,  0x05,  0x02,  0x08,  0x07,  0x00,  0x0f,  0x5d,  0x7a,  0x7a,  0x7d,  0x7f,  0x3f,  0x0f,  0x00,  0x20,  0x50,  0x50,  0x20,  0x08,  0xf0,  0x00,  0xfe,  0xdf,  0xaf,  0xaf,  0xdf,  0xff,  0xfe,  0xf8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x01,  0x03,  0x0f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x80,  0x80,  0x80,  0xc0,  0xe0,  0xf8,  0x18,  0x30,  0x22,  0x05,  0x05,  0x02,  0x08,  0x07,  0x07,  0x0f,  0x5d,  0x7a,  0x7a,  0x7d,  0x7f,  0x3f,  0x00,  0x00,  0x20,  0x50,  0x50,  0x20,  0x08,  0xf0,  0xfc,  0xfe,  0xdf,  0xaf,  0xaf,  0xdf,  0xff,  0xfe);
    vpatch(rom, 0x12400,  384,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x01,  0x01,  0x01,  0x01,  0x03,  0x07,  0x1f,  0x3f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x18,  0x00,  0x00,  0x00,  0x00,  0x80,  0xc0,  0xf0,  0xe0,  0x00,  0x20,  0x50,  0x50,  0x20,  0x08,  0x30,  0x00,  0x7f,  0xdf,  0xaf,  0xaf,  0xdf,  0xff,  0x3f,  0x1f,  0x0c,  0x04,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xf0,  0xfa,  0xfe,  0xfe,  0xfe,  0xfe,  0xfc,  0xf0,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x01,  0x01,  0x01,  0x03,  0x07,  0x1f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x80,  0xc0,  0xf0,  0x00,  0x00,  0x20,  0x50,  0x50,  0x20,  0x08,  0x70,  0x3f,  0x7f,  0xdf,  0xaf,  0xaf,  0xdf,  0xff,  0x7f,  0x18,  0x0c,  0x04,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe0,  0xf0,  0xfa,  0xfe,  0xfe,  0xfe,  0xfe,  0xfc,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x18,  0x00,  0x00,  0x00,  0x00,  0x01,  0x03,  0x0f,  0x07,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x80,  0x80,  0x80,  0x80,  0xc0,  0xe0,  0xf8,  0xfc,  0x30,  0x20,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x0f,  0x5f,  0x7f,  0x7f,  0x7f,  0x7f,  0x3f,  0x0f,  0x00,  0x04,  0x0a,  0x0a,  0x04,  0x10,  0x0c,  0x00,  0xfe,  0xfb,  0xf5,  0xf5,  0xfb,  0xff,  0xfc,  0xf8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x01,  0x03,  0x0f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x80,  0x80,  0x80,  0xc0,  0xe0,  0xf8,  0x18,  0x30,  0x20,  0x00,  0x00,  0x00,  0x00,  0x00,  0x07,  0x0f,  0x5f,  0x7f,  0x7f,  0x7f,  0x7f,  0x3f,  0x00,  0x00,  0x04,  0x0a,  0x0a,  0x04,  0x10,  0x0e,  0xfc,  0xfe,  0xfb,  0xf5,  0xf5,  0xfb,  0xff,  0xfe,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x18,  0x00,  0x00,  0x00,  0x00,  0x01,  0x03,  0x0f,  0x07,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x80,  0x80,  0x80,  0x80,  0xc0,  0xe0,  0xf8,  0xfc,  0x30,  0x20,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x0f,  0x5f,  0x7f,  0x7f,  0x7f,  0x7f,  0x3f,  0x0f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xfe,  0xff,  0xff,  0xff,  0xff,  0xff,  0xfe,  0xf8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x01,  0x03,  0x0f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x80,  0x80,  0x80,  0xc0,  0xe0,  0xf8,  0x18,  0x30,  0x20,  0x00,  0x00,  0x00,  0x00,  0x00,  0x07,  0x0f,  0x5f,  0x7f,  0x7f,  0x7f,  0x7f,  0x3f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xfc,  0xfe,  0xff,  0xff,  0xff,  0xff,  0xff,  0xfe);
    vpatch(rom, 0x12b25,    2,  0x00,  0x00);
    vpatch(rom, 0x12b2e,    1,  0x00);
    vpatch(rom, 0x12b37,    1,  0x00);
    vpatch(rom, 0x12b3f,    1,  0x00);
    vpatch(rom, 0x12b50,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12b65,    3,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12b6f,    1,  0x00);
    vpatch(rom, 0x12b75,    3,  0x08,  0x10,  0x00);
    vpatch(rom, 0x12b7f,    1,  0x00);
    vpatch(rom, 0x12ba7,    1,  0x00);
    vpatch(rom, 0x12baf,    1,  0x00);
    vpatch(rom, 0x12bb7,    1,  0x00);
    vpatch(rom, 0x12bbf,    1,  0x00);
    vpatch(rom, 0x12be6,    1,  0x00);
    vpatch(rom, 0x12bee,    1,  0x00);
    vpatch(rom, 0x12bf6,    2,  0x00,  0x00);
    vpatch(rom, 0x12bfe,    2,  0x00,  0x00);
}